

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_game.cpp
# Opt level: O2

void ChangeSpy(int changespy)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  AActor *pAVar4;
  ulong uVar5;
  DBot *pDVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  bool bVar10;
  
  if (gamestate == GS_LEVEL) {
    pAVar4 = GC::ReadBarrier<AActor>((AActor **)(&DAT_017dc0f8 + (long)consoleplayer * 0x54));
    bVar2 = demoplayback;
    if (pAVar4->player == (player_t *)0x0) {
      if (demoplayback == false) {
        Net_WriteByte('B');
        return;
      }
    }
    else if ((dmflags2.Value._2_1_ & 0x10) == 0) {
      bVar10 = deathmatch.Value == 0;
      uVar5 = (ulong)(uint)consoleplayer;
      uVar9 = consoleplayer;
      uVar8 = consoleplayer;
      if (changespy != 0) {
        pAVar4 = GC::ReadBarrier<AActor>((AActor **)(&DAT_017dc0f8 + (long)consoleplayer * 0x54));
        if (pAVar4->player != (player_t *)0x0) {
          pAVar4 = GC::ReadBarrier<AActor>((AActor **)(&DAT_017dc0f8 + (long)consoleplayer * 0x54));
          uVar5 = (long)&pAVar4->player[-0x916e].morphTics / 0x2a0;
        }
        iVar1 = 7;
        if (changespy == 1) {
          iVar1 = 1;
        }
        uVar5 = uVar5 & 0xffffffff;
        uVar7 = consoleplayer;
        do {
          uVar8 = (int)uVar5 + iVar1 & 7;
          uVar5 = (ulong)uVar8;
          uVar9 = uVar8;
          if (playeringame[uVar5] == true) {
            uVar9 = uVar7;
            if (bVar10 || bVar2 != false) break;
            bVar3 = AActor::IsTeammate((AActor *)(&players)[uVar5 * 0x54],
                                       (AActor *)(&players)[(long)(int)uVar7 * 0x54]);
            uVar9 = consoleplayer;
            if ((bVar3) ||
               ((uVar7 = consoleplayer, uVar9 = uVar8, bot_allowspy.Value != false &&
                (pDVar6 = GC::ReadBarrier<DBot>((DBot **)(&DAT_017dc118 + uVar5 * 0x2a0)),
                uVar7 = consoleplayer, uVar9 = consoleplayer, pDVar6 != (DBot *)0x0)))) break;
          }
        } while (uVar8 != uVar7);
      }
      (&DAT_017dc0f8)[(long)(int)uVar9 * 0x54] = (AActor *)(&players)[(long)(int)uVar8 * 0x54];
      pAVar4 = GC::ReadBarrier<AActor>((AActor **)(&DAT_017dc0f8 + (long)(int)uVar9 * 0x54));
      S_UpdateSounds(pAVar4);
      (*(StatusBar->super_DObject)._vptr_DObject[10])(StatusBar,&players + (long)(int)uVar8 * 0x54);
      if ((demoplayback != false) || (multiplayer == true)) {
        DBaseStatusBar::ShowPlayerName(StatusBar);
        return;
      }
    }
  }
  return;
}

Assistant:

static void ChangeSpy (int changespy)
{
	// If you're not in a level, then you can't spy.
	if (gamestate != GS_LEVEL)
	{
		return;
	}

	// If not viewing through a player, return your eyes to your own head.
	if (players[consoleplayer].camera->player == NULL)
	{
		// When watching demos, you will just have to wait until your player
		// has done this for you, since it could desync otherwise.
		if (!demoplayback)
		{
			Net_WriteByte(DEM_REVERTCAMERA);
		}
		return;
	}

	// We may not be allowed to spy on anyone.
	if (dmflags2 & DF2_DISALLOW_SPYING)
		return;

	// Otherwise, cycle to the next player.
	bool checkTeam = !demoplayback && deathmatch;
	int pnum = consoleplayer;
	if (changespy != SPY_CANCEL) 
	{
		player_t *player = players[consoleplayer].camera->player;
		// only use the camera as starting index if it's a valid player.
		if (player != NULL) pnum = int(players[consoleplayer].camera->player - players);

		int step = (changespy == SPY_NEXT) ? 1 : -1;

		do
		{
			pnum += step;
			pnum &= MAXPLAYERS-1;
			if (playeringame[pnum] &&
				(!checkTeam || players[pnum].mo->IsTeammate (players[consoleplayer].mo) ||
				(bot_allowspy && players[pnum].Bot != NULL)))
			{
				break;
			}
		} while (pnum != consoleplayer);
	}

	players[consoleplayer].camera = players[pnum].mo;
	S_UpdateSounds(players[consoleplayer].camera);
	StatusBar->AttachToPlayer (&players[pnum]);
	if (demoplayback || multiplayer)
	{
		StatusBar->ShowPlayerName ();
	}
}